

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O2

LIndex __thiscall
PlanningUnitMADPDiscrete::IndividualToJointActionObservationHistoryIndex
          (PlanningUnitMADPDiscrete *this,Index t,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *indivIs)

{
  long *plVar1;
  ulong __n;
  int iVar2;
  Index IVar3;
  undefined4 extraout_var;
  uint *puVar4;
  const_reference pvVar5;
  uint uVar6;
  long lVar7;
  Index ts;
  ulong uVar8;
  Index ts_1;
  ulong uVar9;
  vector<unsigned_int,_std::allocator<unsigned_int>_> jobs;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  stageAction;
  vector<unsigned_int,_std::allocator<unsigned_int>_> jacs;
  vector<unsigned_int_*,_std::allocator<unsigned_int_*>_> actionSeqs;
  vector<unsigned_int_*,_std::allocator<unsigned_int_*>_> observSeqs;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  stageObserv;
  allocator_type local_c5;
  Index local_c4;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_c0;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_a8;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_90;
  _Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_> local_78;
  _Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_> local_60;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_48;
  size_type __n_00;
  
  __n = (ulong)t;
  iVar2 = (*(this->super_PlanningUnit)._vptr_PlanningUnit[6])();
  __n_00 = CONCAT44(extraout_var,iVar2);
  std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>::vector
            ((vector<unsigned_int_*,_std::allocator<unsigned_int_*>_> *)&local_60,__n_00,
             (allocator_type *)&local_78);
  std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>::vector
            ((vector<unsigned_int_*,_std::allocator<unsigned_int_*>_> *)&local_78,__n_00,
             (allocator_type *)&local_48);
  local_c4 = t;
  for (uVar6 = 0; uVar9 = (ulong)uVar6, uVar9 < __n_00; uVar6 = uVar6 + 1) {
    puVar4 = (uint *)operator_new__(__n * 4);
    local_60._M_impl.super__Vector_impl_data._M_start[uVar9] = puVar4;
    puVar4 = (uint *)operator_new__(__n * 4);
    local_78._M_impl.super__Vector_impl_data._M_start[uVar9] = puVar4;
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(indivIs,uVar9);
    GetActionObservationHistoryArrays
              (this,uVar6,*pvVar5,local_c4,local_78._M_impl.super__Vector_impl_data._M_start[uVar9],
               local_60._M_impl.super__Vector_impl_data._M_start[uVar9]);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_a8,__n_00,
             (allocator_type *)&local_c0);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(&local_48,__n,(value_type *)&local_a8,(allocator_type *)&local_90);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_a8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_c0,__n_00,
             (allocator_type *)&local_90);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            *)&local_a8,__n,(value_type *)&local_c0,&local_c5);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_c0);
  for (uVar6 = 0; uVar9 = (ulong)uVar6, uVar9 < __n_00; uVar6 = uVar6 + 1) {
    lVar7 = 0;
    for (uVar8 = 0; __n != uVar8; uVar8 = uVar8 + 1) {
      *(uint *)(*(long *)((long)&((local_48.
                                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                 _M_impl.super__Vector_impl_data._M_start + lVar7) + uVar9 * 4) =
           local_60._M_impl.super__Vector_impl_data._M_start[uVar9][uVar8];
      plVar1 = (long *)((long)local_a8._M_impl.super__Vector_impl_data._M_start + lVar7);
      lVar7 = lVar7 + 0x18;
      *(uint *)(*plVar1 + uVar9 * 4) =
           local_78._M_impl.super__Vector_impl_data._M_start[uVar9][uVar8];
    }
  }
  for (uVar6 = 0; uVar9 = (ulong)uVar6, uVar9 < __n_00; uVar6 = uVar6 + 1) {
    if (local_60._M_impl.super__Vector_impl_data._M_start[uVar9] != (uint *)0x0) {
      operator_delete__(local_60._M_impl.super__Vector_impl_data._M_start[uVar9]);
    }
    if (local_78._M_impl.super__Vector_impl_data._M_start[uVar9] != (uint *)0x0) {
      operator_delete__(local_78._M_impl.super__Vector_impl_data._M_start[uVar9]);
    }
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_c0,__n,
             (allocator_type *)&local_90);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_90,__n,
             (allocator_type *)&local_c5);
  lVar7 = 0;
  for (uVar9 = 0; __n != uVar9; uVar9 = uVar9 + 1) {
    uVar6 = (**(code **)((long)*this->_m_madp + 0xe0))
                      (this->_m_madp,
                       (long)&((local_48.
                                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                              _M_impl.super__Vector_impl_data._M_start + lVar7);
    local_c0._M_impl.super__Vector_impl_data._M_start[uVar9] = uVar6;
    uVar6 = (*(this->super_PlanningUnit)._vptr_PlanningUnit[9])
                      (this,(long)local_a8._M_impl.super__Vector_impl_data._M_start + lVar7);
    lVar7 = lVar7 + 0x18;
    local_90._M_impl.super__Vector_impl_data._M_start[uVar9] = uVar6;
  }
  IVar3 = GetJointActionObservationHistoryIndex
                    (this,local_c4,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_90,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_c0);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_90);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_c0);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)&local_a8);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_48);
  std::_Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>::~_Vector_base(&local_78);
  std::_Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>::~_Vector_base(&local_60);
  return (ulong)IVar3;
}

Assistant:

LIndex 
PlanningUnitMADPDiscrete::IndividualToJointActionObservationHistoryIndex(
        Index t, const vector<Index>& indivIs) const
{
    //individual observation history index -> individual observation sequences
    size_t nrAg = GetNrAgents();
    vector< Index* > observSeqs(nrAg);
    vector< Index* > actionSeqs(nrAg);
    for (Index agentI = 0; agentI < nrAg; agentI++)
    {
        observSeqs[agentI] = new Index[t];
        actionSeqs[agentI] = new Index[t];
        Index aohI_thisAgent = indivIs.at(agentI);
        GetActionObservationHistoryArrays (agentI, aohI_thisAgent, t, 
                actionSeqs[agentI], observSeqs[agentI]  );
    }

    // observSeqs[agent][ts] -> stageObserv[ts][agent]
    vector< vector<Index> > stageObserv(t, vector<Index>(nrAg) );
    vector< vector<Index> > stageAction(t, vector<Index>(nrAg) );
    for (Index agentI = 0; agentI < nrAg; agentI++)
        for (Index ts = 0; ts < t; ts++)
        {
            stageObserv[ts][agentI] = observSeqs[agentI][ts];    
            stageAction[ts][agentI] = actionSeqs[agentI][ts];    
        }
    
    for (Index agentI = 0; agentI < nrAg; agentI++)
    {
        delete [] observSeqs[agentI];
        delete [] actionSeqs[agentI];
    }
    
    //individual observation sequences -> joint observation sequences.
    vector<Index> jobs(t);
    vector<Index> jacs(t);
    
    for (Index ts = 0; ts < t; ts++)
    {
        jobs[ts] = IndividualToJointObservationIndices(stageObserv[ts]);
        jacs[ts] = IndividualToJointActionIndices(stageAction[ts]);
        
    }

    //joint observation sequences -> joint history index.
    LIndex jaohI = GetJointActionObservationHistoryIndex(t, jacs, jobs);
    return(jaohI);
    
}